

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

cse_abstract * __thiscall xr_entity_factory::create(xr_entity_factory *this,char *name)

{
  bool bVar1;
  int iVar2;
  xr_ini_file *this_00;
  uint64_t clsid_00;
  xr_clsid *this_01;
  reference ppfVar3;
  undefined4 extraout_var;
  bool local_81;
  char local_69 [8];
  char clsid_name [9];
  anon_union_8_3_e9edf90f_for_xr_clsid_0 local_58;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_50;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_48;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_40;
  iterator it;
  xr_clsid clsid;
  char *name_local;
  xr_entity_factory *this_local;
  
  if (this->m_system_ini == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    xray_re::xr_ini_file::xr_ini_file(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar1 = xray_re::xr_ini_file::section_exist(this->m_system_ini,name);
  if (bVar1) {
    clsid_00 = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    xray_re::xr_clsid::xr_clsid((xr_clsid *)&it,clsid_00);
    local_48._M_current =
         (factory_item_base **)
         std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::begin
                   (&this->m_clsids);
    local_50._M_current =
         (factory_item_base **)
         std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::end
                   (&this->m_clsids);
    clsid_pred2::clsid_pred2((clsid_pred2 *)&local_58,(xr_clsid *)&it);
    local_40 = xray_re::
               lower_bound_if<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,clsid_pred2>
                         (local_48,local_50,(clsid_pred2)local_58);
    clsid_name._1_8_ =
         std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::end
                   (&this->m_clsids);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        *)(clsid_name + 1));
    local_81 = false;
    if (bVar1) {
      ppfVar3 = __gnu_cxx::
                __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                ::operator*(&local_40);
      this_01 = factory_item_base::clsid(*ppfVar3);
      local_81 = xray_re::xr_clsid::operator==(this_01,(xr_clsid *)&it);
    }
    if (local_81 == false) {
      memset(local_69,0,9);
      xray_re::xr_clsid::get((xr_clsid *)&it,local_69);
      xray_re::msg("can\'t create entity %s, %s",name,local_69);
      this_local = (xr_entity_factory *)0x0;
    }
    else {
      ppfVar3 = __gnu_cxx::
                __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                ::operator*(&local_40);
      iVar2 = (*(*ppfVar3)->_vptr_factory_item_base[2])();
      this_local = (xr_entity_factory *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    xray_re::msg("can\'t find entity %s",name);
    this_local = (xr_entity_factory *)0x0;
  }
  return (cse_abstract *)this_local;
}

Assistant:

cse_abstract* xr_entity_factory::create(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");

	if (!m_system_ini->section_exist(name)) {
		msg("can't find entity %s", name);
		return 0;
	}

	xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
	std::vector<factory_item_base*>::iterator it = lower_bound_if(
			m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
	if (it != m_clsids.end() && (*it)->clsid() == clsid)
		return (*it)->create();

	char clsid_name[9] = {};
	clsid.get(clsid_name);
	msg("can't create entity %s, %s", name, clsid_name);
	return 0;
}